

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Fillet3::Get_y_dxdx(ChFunction_Fillet3 *this,double x)

{
  undefined1 in_register_00001208 [56];
  undefined1 auVar1 [64];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar1._8_56_ = in_register_00001208;
  auVar1._0_8_ = x;
  if ((0.0 < x) && (x < this->end)) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->c1 * 6.0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->c2 + this->c2;
    auVar2 = vfmadd213sd_fma(auVar1._0_16_,auVar2,auVar3);
    return auVar2._0_8_;
  }
  return 0.0;
}

Assistant:

double ChFunction_Fillet3::Get_y_dxdx(double x) const {
    double ret = 0;
    if (x <= 0)
        return 0;
    if (x >= end)
        return 0;
    ret = 6 * c1 * x + 2 * c2;
    return ret;
}